

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::BeginQuery(DeviceContextVkImpl *this,IQuery *pQuery)

{
  QUERY_TYPE Type;
  undefined *puVar1;
  bool bVar2;
  Uint32 query;
  Char *pCVar3;
  QueryVkImpl *this_00;
  QueryDesc *pQVar4;
  VkQueryPool queryPool;
  undefined8 uVar5;
  char (*in_R8) [115];
  char *local_f8;
  undefined1 local_f0 [8];
  string _msg_1;
  StateCache *CmdBuffState;
  string _msg;
  string msg_2;
  Uint32 Idx;
  VkQueryPool vkQueryPool;
  QUERY_TYPE QueryType;
  QueryVkImpl *pQueryVkImpl;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IQuery *pQuery_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pQuery;
  DeviceContextBase<Diligent::EngineVkImplTraits>::BeginQuery
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pQuery,0);
  if ((this->m_pQueryMgr == (QueryManagerVk *)0x0) &&
     (bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                        ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this), !bVar2)) {
    FormatString<char[80]>
              ((string *)local_38,
               (char (*) [80])
               "Query manager should never be null for immediate contexts. This might be a bug.");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb47);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    FormatString<char[94]>
              ((string *)&pQueryVkImpl,
               (char (*) [94])
               "Query manager is null, which indicates that this deferred context is not in a recording state"
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb48);
    std::__cxx11::string::~string((string *)&pQueryVkImpl);
  }
  this_00 = ClassPtrCast<Diligent::QueryVkImpl,Diligent::IQuery>((IQuery *)msg.field_2._8_8_);
  pQVar4 = DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
           GetDesc((DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                    *)this_00);
  Type = pQVar4->Type;
  queryPool = QueryManagerVk::GetQueryPool(this->m_pQueryMgr,Type);
  query = QueryVkImpl::GetQueryPoolIndex(this_00,0);
  if (queryPool == (VkQueryPool)0x0) {
    FormatString<char[45]>
              ((string *)((long)&_msg.field_2 + 8),
               (char (*) [45])"Query pool is not initialized for query type");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb4f);
    std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
  }
  EnsureVkCmdBuffer(this);
  if (Type == QUERY_TYPE_TIMESTAMP) {
    FormatString<char[47]>
              ((string *)&CmdBuffState,
               (char (*) [47])"BeginQuery() is disabled for timestamp queries");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar5,0);
    }
    std::__cxx11::string::~string((string *)&CmdBuffState);
  }
  else if (Type == QUERY_TYPE_DURATION) {
    VulkanUtilities::VulkanCommandBuffer::WriteTimestamp
              (&this->m_CommandBuffer,VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,queryPool,query);
  }
  else {
    _msg_1.field_2._8_8_ = VulkanUtilities::VulkanCommandBuffer::GetState(&this->m_CommandBuffer);
    if (((((StateCache *)_msg_1.field_2._8_8_)->InsidePassQueries |
         ((StateCache *)_msg_1.field_2._8_8_)->OutsidePassQueries) & 1 << ((byte)Type & 0x1f)) == 0)
    {
      this->m_ActiveQueriesCounter = this->m_ActiveQueriesCounter + 1;
      VulkanUtilities::VulkanCommandBuffer::BeginQuery
                (&this->m_CommandBuffer,queryPool,query,(uint)(Type == QUERY_TYPE_OCCLUSION),
                 1 << ((byte)Type & 0x1f));
    }
    else {
      local_f8 = GetQueryTypeString(Type);
      FormatString<char[23],char_const*,char[115]>
                ((string *)local_f0,(Diligent *)"Another query of type ",(char (*) [23])&local_f8,
                 (char **)
                 " is currently active. Overlapping queries do not work in Vulkan. End the first query before beginning another one."
                 ,in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar5 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar5,0);
      }
      std::__cxx11::string::~string((string *)local_f0);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BeginQuery(IQuery* pQuery)
{
    TDeviceContextBase::BeginQuery(pQuery, 0);

    VERIFY(m_pQueryMgr != nullptr || IsDeferred(), "Query manager should never be null for immediate contexts. This might be a bug.");
    DEV_CHECK_ERR(m_pQueryMgr != nullptr, "Query manager is null, which indicates that this deferred context is not in a recording state");

    QueryVkImpl*     pQueryVkImpl = ClassPtrCast<QueryVkImpl>(pQuery);
    const QUERY_TYPE QueryType    = pQueryVkImpl->GetDesc().Type;
    VkQueryPool      vkQueryPool  = m_pQueryMgr->GetQueryPool(QueryType);
    Uint32           Idx          = pQueryVkImpl->GetQueryPoolIndex(0);

    VERIFY(vkQueryPool != VK_NULL_HANDLE, "Query pool is not initialized for query type");

    EnsureVkCmdBuffer();
    if (QueryType == QUERY_TYPE_TIMESTAMP)
    {
        LOG_ERROR_MESSAGE("BeginQuery() is disabled for timestamp queries");
    }
    else if (QueryType == QUERY_TYPE_DURATION)
    {
        m_CommandBuffer.WriteTimestamp(VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, vkQueryPool, Idx);
    }
    else
    {
        const VulkanUtilities::VulkanCommandBuffer::StateCache& CmdBuffState = m_CommandBuffer.GetState();
        if ((CmdBuffState.InsidePassQueries | CmdBuffState.OutsidePassQueries) & (1u << QueryType))
        {
            LOG_ERROR_MESSAGE("Another query of type ", GetQueryTypeString(QueryType),
                              " is currently active. Overlapping queries do not work in Vulkan. "
                              "End the first query before beginning another one.");
            return;
        }

        // A query must either begin and end inside the same subpass of a render pass instance, or must
        // both begin and end outside of a render pass instance (i.e. contain entire render pass instances).

        ++m_ActiveQueriesCounter;
        m_CommandBuffer.BeginQuery(vkQueryPool,
                                   Idx,
                                   // If flags does not contain VK_QUERY_CONTROL_PRECISE_BIT an implementation
                                   // may generate any non-zero result value for the query if the count of
                                   // passing samples is non-zero.
                                   QueryType == QUERY_TYPE_OCCLUSION ? VK_QUERY_CONTROL_PRECISE_BIT : 0,
                                   1u << QueryType);
    }
}